

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O3

uc_err uc_set_tlb(uc_struct_conflict15 *uc,int mode)

{
  CPUClass *pCVar1;
  code *pcVar2;
  
  if (mode == 0) {
    pCVar1 = uc->cpu->cc;
    pcVar2 = pCVar1->tlb_fill_cpu;
  }
  else {
    if (mode != 1) {
      return UC_ERR_ARG;
    }
    pCVar1 = uc->cpu->cc;
    pcVar2 = unicorn_fill_tlb_tricore;
  }
  pCVar1->tlb_fill = pcVar2;
  return UC_ERR_OK;
}

Assistant:

static uc_err uc_set_tlb(struct uc_struct *uc, int mode) {
    switch (mode) {
        case UC_TLB_VIRTUAL:
            uc->cpu->cc->tlb_fill = unicorn_fill_tlb;
            return UC_ERR_OK;
        case UC_TLB_CPU:
            uc->cpu->cc->tlb_fill = uc->cpu->cc->tlb_fill_cpu;
            return UC_ERR_OK;
        default:
            return UC_ERR_ARG;
    }
}